

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O0

qsizetype __thiscall QVLABase<char>::indexOf<char>(QVLABase<char> *this,char *t,qsizetype from)

{
  size_type sVar1;
  longlong *plVar2;
  const_iterator pcVar3;
  char *pcVar4;
  long in_RDX;
  char *in_RSI;
  QVLABaseBase *in_RDI;
  long in_FS_OFFSET;
  char *e;
  char *n;
  QVLABase<char> *in_stack_ffffffffffffff90;
  char *local_40;
  long local_38;
  long local_20;
  longlong local_18;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = in_RDX;
  if (in_RDX < 0) {
    sVar1 = QVLABaseBase::size(in_RDI);
    local_10 = in_RDX + sVar1;
    local_18 = 0;
    plVar2 = qMax<long_long>(&local_10,&local_18);
    local_38 = *plVar2;
  }
  sVar1 = QVLABaseBase::size(in_RDI);
  if (local_38 < sVar1) {
    local_40 = data((QVLABase<char> *)in_RDI);
    local_40 = local_40 + local_38 + -1;
    pcVar3 = end(in_stack_ffffffffffffff90);
    do {
      local_40 = local_40 + 1;
      if (local_40 == pcVar3) goto LAB_008ca8c6;
    } while (*local_40 != *in_RSI);
    pcVar4 = data((QVLABase<char> *)in_RDI);
    local_20 = (long)local_40 - (long)pcVar4;
  }
  else {
LAB_008ca8c6:
    local_20 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_20;
}

Assistant:

Q_INLINE_TEMPLATE qsizetype QVLABase<T>::indexOf(const AT &t, qsizetype from) const
{
    if (from < 0)
        from = qMax(from + size(), qsizetype(0));
    if (from < size()) {
        const T *n = data() + from - 1;
        const T *e = end();
        while (++n != e)
            if (*n == t)
                return n - data();
    }
    return -1;
}